

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontendTest.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_104a6::TestBuildSystemFrontendDelegate::commandProcessStarted
          (TestBuildSystemFrontendDelegate *this,Command *command,ProcessHandle handle)

{
  int iVar1;
  StringRef Str;
  int iVar2;
  raw_ostream *prVar3;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->traceMutex);
  if (iVar2 == 0) {
    iVar1 = this->currentlyRunningTasks;
    iVar2 = iVar1 + 1;
    this->currentlyRunningTasks = iVar2;
    if (this->maxRunningTasks <= iVar1) {
      this->maxRunningTasks = iVar2;
    }
    Str_00.Length = 0x15;
    Str_00.Data = "commandProcessStarted";
    prVar3 = llvm::raw_ostream::operator<<(&(this->traceStream).super_raw_ostream,Str_00);
    Str_01.Length = 2;
    Str_01.Data = ": ";
    prVar3 = llvm::raw_ostream::operator<<(prVar3,Str_01);
    Str.Data = (command->name)._M_dataplus._M_p;
    Str.Length = (command->name)._M_string_length;
    prVar3 = llvm::raw_ostream::operator<<(prVar3,Str);
    Str_02.Length = 1;
    Str_02.Data = "\n";
    llvm::raw_ostream::operator<<(prVar3,Str_02);
    pthread_mutex_unlock((pthread_mutex_t *)&this->traceMutex);
    llbuild::buildsystem::BuildSystemFrontendDelegate::commandProcessStarted
              (&this->super_BuildSystemFrontendDelegate,command,handle);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

virtual void commandProcessStarted(Command* command, ProcessHandle handle) override {
    {
      std::lock_guard<std::mutex> lock(traceMutex);

      // Keep track of max build parallelism
      currentlyRunningTasks++;
      if (currentlyRunningTasks > maxRunningTasks)
        maxRunningTasks = currentlyRunningTasks;

      traceStream << __func__ << ": " << command->getName() << "\n";
    }
    super::commandProcessStarted(command, handle);
  }